

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemerror.cpp
# Opt level: O0

QString * standardLibraryErrorString(int errorCode)

{
  long lVar1;
  QByteArrayView ba;
  QByteArrayView ba_00;
  char *pcVar2;
  int in_ESI;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  QString ret;
  char *s;
  QString *in_stack_ffffffffffffff48;
  QString *in_stack_ffffffffffffff50;
  QByteArrayView *this;
  storage_type *in_stack_ffffffffffffffb0;
  qsizetype in_stack_ffffffffffffffd0;
  storage_type *psVar3;
  char *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (char *)0x0;
  psVar3 = (storage_type *)0xaaaaaaaaaaaaaaaa;
  this = in_RDI;
  QString::QString((QString *)0x131ab8);
  switch(in_ESI) {
  case 0:
    break;
  default:
    pcVar2 = strerror(in_ESI);
    QByteArrayView::QByteArrayView<char_*,_true>(this,(char **)in_RDI);
    ba.m_data = in_stack_ffffffffffffffb0;
    ba.m_size = (qsizetype)pcVar2;
    QString::fromLocal8Bit(ba);
    QString::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    QString::~QString((QString *)0x131b76);
    break;
  case 2:
    local_10 = "No such file or directory";
    break;
  case 0xd:
    local_10 = "Permission denied";
    break;
  case 0x18:
    local_10 = "Too many open files";
    break;
  case 0x1c:
    local_10 = "No space left on device";
  }
  if (local_10 != (char *)0x0) {
    QByteArrayView::QByteArrayView<const_char_*,_true>(this,(char **)in_RDI);
    ba_00.m_data = psVar3;
    ba_00.m_size = in_stack_ffffffffffffffd0;
    QString::fromLatin1(ba_00);
    QString::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    QString::~QString((QString *)0x131bc3);
  }
  QString::trimmed(in_stack_ffffffffffffff48);
  QString::~QString((QString *)0x131be4);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)this;
  }
  __stack_chk_fail();
}

Assistant:

static QString standardLibraryErrorString(int errorCode)
{
    const char *s = nullptr;
    QString ret;
    switch (errorCode) {
    case 0:
        break;
    case EACCES:
        s = QT_TRANSLATE_NOOP("QIODevice", "Permission denied");
        break;
    case EMFILE:
        s = QT_TRANSLATE_NOOP("QIODevice", "Too many open files");
        break;
    case ENOENT:
        s = QT_TRANSLATE_NOOP("QIODevice", "No such file or directory");
        break;
    case ENOSPC:
        s = QT_TRANSLATE_NOOP("QIODevice", "No space left on device");
        break;
    default: {
      #if QT_CONFIG(thread) && defined(_POSIX_THREAD_SAFE_FUNCTIONS) && _POSIX_VERSION >= 200112L && !defined(Q_OS_INTEGRITY) && !defined(Q_OS_QNX)
            QByteArray buf(1024, Qt::Uninitialized);
            ret = fromstrerror_helper(strerror_r(errorCode, buf.data(), buf.size()), buf);
      #else
            ret = QString::fromLocal8Bit(strerror(errorCode));
      #endif
    break; }
    }
    if (s) {
#ifndef QT_BOOTSTRAPPED
        ret = QCoreApplication::translate("QIODevice", s);
#else
        ret = QString::fromLatin1(s);
#endif
    }
    return ret.trimmed();
}